

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::AggressiveDCEPass::AddUnreachable(AggressiveDCEPass *this,BasicBlock **block)

{
  InstructionBuilder builder;
  InstructionBuilder local_20;
  
  local_20.context_ = (this->super_MemPass).super_Pass.context_;
  local_20.parent_ = *block;
  local_20.insert_before_.super_iterator.node_ =
       (iterator)
       &((local_20.parent_)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_20.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  InstructionBuilder::AddUnreachable(&local_20);
  return;
}

Assistant:

void AggressiveDCEPass::AddUnreachable(BasicBlock*& block) {
  InstructionBuilder builder(
      context(), block,
      IRContext::kAnalysisInstrToBlockMapping | IRContext::kAnalysisDefUse);
  builder.AddUnreachable();
}